

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O1

Mesh * Omega_h::read_mesh_file(Mesh *__return_storage_ptr__,path *path,CommPtr *comm)

{
  char cVar1;
  int iVar2;
  Library *pLVar3;
  value_type *pvVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char *format;
  string extension;
  ifstream stream;
  string local_288;
  CommPtr local_268;
  CommPtr local_258;
  element_type *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  element_type *local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_230;
  path local_228 [16];
  
  filesystem::path::extension(local_228,path);
  filesystem::path::string_abi_cxx11_(&local_288,local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0].impl._M_dataplus._M_p != &local_228[0].impl.field_2) {
    operator_delete(local_228[0].impl._M_dataplus._M_p,
                    local_228[0].impl.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_288);
  if (iVar2 == 0) {
    local_238 = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_230 = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
    if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_230->_M_use_count = local_230->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_230->_M_use_count = local_230->_M_use_count + 1;
      }
    }
    binary::read((binary *)__return_storage_ptr__,(int)path,&local_238,0);
    this = local_230;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_288);
    if (iVar2 == 0) {
      format = "Omega_h: Can\'t read %s without reconfiguring with OMEGA_H_USE_libMeshb=ON\n";
LAB_002be971:
      pvVar4 = filesystem::path::c_str(path);
      fail(format,pvVar4);
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_288);
    format = "Omega_h: Can\'t read %s without reconfiguring with OMEGA_H_USE_SEACASExodus=ON\n";
    if (iVar2 == 0) goto LAB_002be971;
    iVar2 = std::__cxx11::string::compare((char *)&local_288);
    if (iVar2 == 0) goto LAB_002be971;
    iVar2 = std::__cxx11::string::compare((char *)&local_288);
    if (iVar2 == 0) goto LAB_002be971;
    iVar2 = std::__cxx11::string::compare((char *)&local_288);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_288);
      if (iVar2 == 0) {
        pLVar3 = Comm::library((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr);
        Mesh::Mesh(__return_storage_ptr__,pLVar3);
        local_258.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_258.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
        ;
        if (local_258.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_258.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_258.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_258.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_258.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        vtk::read_parallel(path,&local_258,__return_storage_ptr__);
        if (local_258.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_258.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        Mesh::set_comm(__return_storage_ptr__,comm);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_288);
        if (iVar2 != 0) {
          pvVar4 = filesystem::path::c_str(path);
          fail("Unknown file extension \"%s\" on \"%s\"\n",local_288._M_dataplus._M_p,pvVar4);
        }
        pLVar3 = Comm::library((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr);
        Mesh::Mesh(__return_storage_ptr__,pLVar3);
        pvVar4 = filesystem::path::c_str(path);
        std::ifstream::ifstream(local_228,pvVar4,_S_in);
        cVar1 = std::__basic_file<char>::is_open();
        if (cVar1 == '\0') {
          fail("assertion %s failed at %s +%d\n","stream.is_open()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
               ,0x2ae);
        }
        local_268.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_268.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
        ;
        if (local_268.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_268.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_268.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_268.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_268.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        vtk::read_vtu((istream *)local_228,&local_268,__return_storage_ptr__);
        if (local_268.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_268.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::ifstream::~ifstream(local_228);
      }
      goto LAB_002be93d;
    }
    local_248 = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_240 = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
    if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_240->_M_use_count = local_240->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_240->_M_use_count = local_240->_M_use_count + 1;
      }
    }
    gmsh::read((int)__return_storage_ptr__,path,(size_t)&local_248);
    this = local_240;
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
LAB_002be93d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

OMEGA_H_DLL Mesh read_mesh_file(filesystem::path const& path, CommPtr comm) {
  auto const extension = path.extension().string();
  if (extension == ".osh") {
    return binary::read(path, comm);
  } else if (extension == ".meshb") {
#ifdef OMEGA_H_USE_LIBMESHB
    Mesh mesh(comm->library());
    meshb::read(&mesh, path.c_str());
    mesh.set_comm(comm);
    return mesh;
#else
    Omega_h_fail(
        "Omega_h: Can't read %s without reconfiguring with "
        "OMEGA_H_USE_libMeshb=ON\n",
        path.c_str());
    OMEGA_H_NORETURN(Mesh());
#endif
  } else if (extension == ".exo" || extension == ".e" || extension == ".g") {
#ifdef OMEGA_H_USE_SEACASEXODUS
    Mesh mesh(comm->library());
    auto file = exodus::open(path);
    exodus::read_mesh(file, &mesh);
    mesh.set_comm(comm);
    exodus::close(file);
    return mesh;
#else
    Omega_h_fail(
        "Omega_h: Can't read %s without reconfiguring with "
        "OMEGA_H_USE_SEACASExodus=ON\n",
        path.c_str());
    OMEGA_H_NORETURN(Mesh());
#endif
  } else if (extension == ".msh") {
    return gmsh::read(path, comm);
  } else if (extension == ".pvtu") {
    Mesh mesh(comm->library());
    vtk::read_parallel(path, comm, &mesh);
    mesh.set_comm(comm);
    return mesh;
  } else if (extension == ".vtu") {
    Mesh mesh(comm->library());
    std::ifstream stream(path.c_str());
    OMEGA_H_CHECK(stream.is_open());
    vtk::read_vtu(stream, comm, &mesh);
    return mesh;
  } else {
    Omega_h_fail("Unknown file extension \"%s\" on \"%s\"\n", extension.c_str(),
        path.c_str());
  }
}